

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLimits.cpp
# Opt level: O2

void __thiscall
glcts::GeometryShaderMaxUniformBlocksTest::prepareProgramInput
          (GeometryShaderMaxUniformBlocksTest *this)

{
  vector<glcts::GeometryShaderMaxUniformBlocksTest::_uniform_block,_std::allocator<glcts::GeometryShaderMaxUniformBlocksTest::_uniform_block>_>
  *this_00;
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  undefined4 *puVar4;
  ulong uVar5;
  long lVar6;
  long lVar3;
  
  iVar1 = (*((this->super_GeometryShaderLimitsTransformFeedbackBase).super_TestCaseBase.m_context)->
            m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  this_00 = &this->m_uniform_blocks;
  std::
  vector<glcts::GeometryShaderMaxUniformBlocksTest::_uniform_block,_std::allocator<glcts::GeometryShaderMaxUniformBlocksTest::_uniform_block>_>
  ::resize(this_00,(long)this->m_max_uniform_blocks);
  lVar6 = 0;
  uVar5 = 0;
  while ((long)uVar5 < (long)this->m_max_uniform_blocks) {
    (**(code **)(lVar3 + 0x6c8))
              (1,(long)&((this_00->
                         super__Vector_base<glcts::GeometryShaderMaxUniformBlocksTest::_uniform_block,_std::allocator<glcts::GeometryShaderMaxUniformBlocksTest::_uniform_block>_>
                         )._M_impl.super__Vector_impl_data._M_start)->buffer_object_id + lVar6);
    (**(code **)(lVar3 + 0x40))
              (0x8a11,*(undefined4 *)
                       ((long)&((this_00->
                                super__Vector_base<glcts::GeometryShaderMaxUniformBlocksTest::_uniform_block,_std::allocator<glcts::GeometryShaderMaxUniformBlocksTest::_uniform_block>_>
                                )._M_impl.super__Vector_impl_data._M_start)->buffer_object_id +
                       lVar6));
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"Failed create buffer object",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                    ,0x615);
    puVar4 = (undefined4 *)
             ((long)&((this_00->
                      super__Vector_base<glcts::GeometryShaderMaxUniformBlocksTest::_uniform_block,_std::allocator<glcts::GeometryShaderMaxUniformBlocksTest::_uniform_block>_>
                      )._M_impl.super__Vector_impl_data._M_start)->data + lVar6);
    *puVar4 = (int)(uVar5 + 1);
    (**(code **)(lVar3 + 0x150))(0x8a11,4,puVar4,0x88e4);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"Failed to set buffer data",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                    ,0x61d);
    (**(code **)(lVar3 + 0x48))
              (0x8a11,uVar5 & 0xffffffff,
               *(undefined4 *)
                ((long)&((this_00->
                         super__Vector_base<glcts::GeometryShaderMaxUniformBlocksTest::_uniform_block,_std::allocator<glcts::GeometryShaderMaxUniformBlocksTest::_uniform_block>_>
                         )._M_impl.super__Vector_impl_data._M_start)->buffer_object_id + lVar6));
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"Failed to bind buffer to uniform block",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                    ,0x621);
    lVar6 = lVar6 + 8;
    uVar5 = uVar5 + 1;
  }
  return;
}

Assistant:

void GeometryShaderMaxUniformBlocksTest::prepareProgramInput()
{
	/* Retrieve ES entry-points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Allocate memory */
	m_uniform_blocks.resize(m_max_uniform_blocks);

	/* Setup uniform blocks */
	for (glw::GLint i = 0; i < m_max_uniform_blocks; ++i)
	{
		/* Generate and bind */
		gl.genBuffers(1, &m_uniform_blocks[i].buffer_object_id);
		gl.bindBuffer(GL_UNIFORM_BUFFER, m_uniform_blocks[i].buffer_object_id);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed create buffer object");

		/** Expected data is range <1;GL_MAX_GEOMETRY_UNIFORM_BLOCKS_EXT>
		 *  See test description for details
		 **/
		m_uniform_blocks[i].data = i + 1;

		gl.bufferData(GL_UNIFORM_BUFFER, sizeof(glw::GLint), &m_uniform_blocks[i].data, GL_STATIC_DRAW);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to set buffer data");

		/* Bind buffer to uniform block */
		gl.bindBufferBase(GL_UNIFORM_BUFFER, i, m_uniform_blocks[i].buffer_object_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to bind buffer to uniform block");
	}
}